

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O3

void poly1305_block(cf_poly1305 *ctx,uint32_t *c)

{
  uint uVar1;
  int i;
  long lVar2;
  uint32_t *puVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  uint32_t accum;
  uint32_t *puVar7;
  ulong uVar8;
  long lVar9;
  uint local_48 [18];
  
  lVar2 = 0;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + ctx->h[lVar2] + c[lVar2];
    ctx->h[lVar2] = uVar4 & 0xff;
    uVar4 = uVar4 >> 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x11);
  puVar3 = ctx->r;
  lVar2 = 1;
  uVar5 = 0;
  do {
    lVar9 = 0;
    uVar4 = 0;
    puVar7 = puVar3;
    do {
      uVar4 = uVar4 + *puVar7 * ctx->h[lVar9];
      lVar9 = lVar9 + 1;
      puVar7 = puVar7 + -1;
    } while (lVar2 != lVar9);
    uVar8 = uVar5;
    puVar7 = ctx->r + 0x10;
    if (uVar5 < 0x10) {
      do {
        uVar4 = uVar4 + ctx->h[uVar8 + 1] * *puVar7 * 0x140;
        uVar8 = uVar8 + 1;
        puVar7 = puVar7 + -1;
      } while (uVar8 != 0x10);
    }
    local_48[uVar5] = uVar4;
    uVar5 = uVar5 + 1;
    lVar2 = lVar2 + 1;
    puVar3 = puVar3 + 1;
  } while (uVar5 != 0x11);
  lVar2 = 0;
  uVar4 = 0;
  do {
    uVar1 = local_48[lVar2];
    local_48[lVar2] = uVar4 + uVar1 & 0xff;
    uVar4 = uVar4 + uVar1 >> 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  uVar4 = uVar4 + local_48[0x10];
  local_48[0x10] = uVar4 & 3;
  uVar4 = (uVar4 >> 2) * 5;
  lVar2 = 0;
  do {
    uVar1 = local_48[lVar2];
    local_48[lVar2] = uVar4 + uVar1 & 0xff;
    uVar4 = uVar4 + uVar1 >> 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  local_48[0x10] = local_48[0x10] + uVar4;
  puVar6 = local_48;
  for (lVar2 = 0x11; lVar2 != 0; lVar2 = lVar2 + -1) {
    ctx->h[0] = *puVar6;
    puVar6 = puVar6 + 1;
    ctx = (cf_poly1305 *)(ctx->h + 1);
  }
  return;
}

Assistant:

static void poly1305_block(cf_poly1305 *ctx,
                           const uint32_t c[17])
{
  poly1305_add(ctx->h, c);
  poly1305_mul(ctx->h, ctx->r);
}